

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O1

NondegeneracyCheckResult * __thiscall
slang::ast::SimpleAssertionExpr::checkNondegeneracyImpl
          (NondegeneracyCheckResult *__return_storage_ptr__,SimpleAssertionExpr *this)

{
  SyntaxNode *this_00;
  Expression *pEVar1;
  Type *this_01;
  uint uVar2;
  AssertionInstanceExpression *aie;
  SourceRange SVar3;
  NondegeneracyCheckResult local_40;
  
  (__return_storage_ptr__->status).m_bits = 0;
  (__return_storage_ptr__->noMatchRange).startLoc = (SourceLocation)0x0;
  (__return_storage_ptr__->noMatchRange).endLoc = (SourceLocation)0x0;
  __return_storage_ptr__->isAlwaysFalse = false;
  if (this->isNullExpr == true) {
    (__return_storage_ptr__->status).m_bits = 4;
    this_00 = (this->super_AssertionExpr).syntax;
    if (this_00 != (SyntaxNode *)0x0) {
      SVar3 = slang::syntax::SyntaxNode::sourceRange(this_00);
      __return_storage_ptr__->noMatchRange = SVar3;
      __return_storage_ptr__->isAlwaysFalse = true;
    }
  }
  if ((this->repetition).super__Optional_base<slang::ast::SequenceRepetition,_true,_true>._M_payload
      .super__Optional_payload_base<slang::ast::SequenceRepetition>._M_engaged == true) {
    uVar2 = 0;
    if ((this->repetition).super__Optional_base<slang::ast::SequenceRepetition,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::SequenceRepetition>._M_payload._M_value.
        range.min == 0) {
      uVar2 = (uint)(byte)(*(int *)&(this->repetition).
                                    super__Optional_base<slang::ast::SequenceRepetition,_true,_true>
                                    ._M_payload.
                                    super__Optional_payload_base<slang::ast::SequenceRepetition>.
                                    _M_payload._M_value.range.max.
                                    super__Optional_base<unsigned_int,_true,_true>._M_payload == 0 &
                          (this->repetition).
                          super__Optional_base<slang::ast::SequenceRepetition,_true,_true>.
                          _M_payload.super__Optional_payload_base<slang::ast::SequenceRepetition>.
                          _M_payload.field2[0xc]) * 2 + 1;
    }
    (__return_storage_ptr__->status).m_bits = (__return_storage_ptr__->status).m_bits | uVar2;
    if (((ulong)(__return_storage_ptr__->noMatchRange).startLoc & 0xfffffff) == 0) {
      (__return_storage_ptr__->noMatchRange).startLoc = (SourceLocation)0x0;
      (__return_storage_ptr__->noMatchRange).endLoc = (SourceLocation)0x0;
      __return_storage_ptr__->isAlwaysFalse = false;
    }
  }
  pEVar1 = this->expr;
  if (pEVar1->kind == AssertionInstance) {
    this_01 = (pEVar1->type).ptr;
    if (this_01->canonical == (Type *)0x0) {
      Type::resolveCanonical(this_01);
    }
    if ((this_01->canonical->super_Symbol).kind == SequenceType) {
      AssertionExpr::checkNondegeneracy(&local_40,(AssertionExpr *)pEVar1[1].type.ptr);
      (__return_storage_ptr__->status).m_bits =
           (__return_storage_ptr__->status).m_bits | local_40.status.m_bits;
      if (((ulong)(__return_storage_ptr__->noMatchRange).startLoc & 0xfffffff) == 0) {
        (__return_storage_ptr__->noMatchRange).startLoc = local_40.noMatchRange.startLoc;
        (__return_storage_ptr__->noMatchRange).endLoc = local_40.noMatchRange.endLoc;
        __return_storage_ptr__->isAlwaysFalse = local_40.isAlwaysFalse;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

AssertionExpr::NondegeneracyCheckResult SimpleAssertionExpr::checkNondegeneracyImpl() const {
    // If simple sequence expression can be evaluated to false
    // then it admits no possible match.
    NondegeneracyCheckResult result;
    if (isNullExpr) {
        result.status |= NondegeneracyStatus::AdmitsNoMatch;
        if (syntax) {
            result.noMatchRange = syntax->sourceRange();
            result.isAlwaysFalse = true;
        }
    }

    if (repetition)
        result |= repetition->checkNondegeneracy();

    if (expr.kind == ExpressionKind::AssertionInstance) {
        auto& aie = expr.as<AssertionInstanceExpression>();
        if (aie.type->isSequenceType())
            result |= aie.body.checkNondegeneracy();
    }
    return result;
}